

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::match(CharScanner *this,int c)

{
  int iVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  CharScanner *in_stack_00000018;
  bool in_stack_00000027;
  int la_1;
  
  iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
  if (iVar1 != in_ESI) {
    uVar2 = __cxa_allocate_exception(0x90);
    MismatchedCharException::MismatchedCharException
              ((MismatchedCharException *)this,c,la_1,in_stack_00000027,in_stack_00000018);
    __cxa_throw(uVar2,&MismatchedCharException::typeinfo,
                MismatchedCharException::~MismatchedCharException);
  }
  (**(code **)(*in_RDI + 0x40))();
  return;
}

Assistant:

virtual void match(int c)
	{
		int la_1 = LA(1);
		if ( la_1 != c )
			throw MismatchedCharException(la_1, c, false, this);
		consume();
	}